

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_spline.cpp
# Opt level: O1

ChQuaternion<double> * __thiscall
chrono::ChFunctionRotation_spline::Get_q
          (ChQuaternion<double> *__return_storage_ptr__,ChFunctionRotation_spline *this,double s)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  pointer pCVar8;
  int i;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  double dVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  ChVectorDynamic<> N;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_78;
  double local_68;
  double local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  double local_40;
  ulong local_38;
  double local_30;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  (*((this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  if (this->closed == true) {
    s = fmod(s,1.0);
  }
  dVar14 = ComputeKnotUfromU(this,s);
  i = geometry::ChBasisToolsBspline::FindSpan(this->p,dVar14,&this->knots);
  local_78.m_storage.m_data = (double *)0x0;
  local_78.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_78,(long)this->p + 1);
  geometry::ChBasisToolsBspline::BasisEvaluate
            (this->p,i,dVar14,&this->knots,(ChVectorDynamic<> *)&local_78);
  lVar10 = (long)i - (long)this->p;
  pCVar8 = (this->rotations).
           super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dVar14 = pCVar8[lVar10].m_data[0];
  dVar17 = pCVar8[lVar10].m_data[1];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar17;
  dVar18 = pCVar8[lVar10].m_data[2];
  dVar16 = pCVar8[lVar10].m_data[3];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar16;
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[3] = 0.0;
  dVar45 = 0.0;
  if (0 < local_78.m_storage.m_rows) {
    lVar9 = 0;
    do {
      dVar45 = dVar45 + local_78.m_storage.m_data[lVar9];
      lVar9 = lVar9 + 1;
    } while (local_78.m_storage.m_rows != lVar9);
  }
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar18 * dVar18;
  auVar13 = vfmadd231sd_fma(auVar20,auVar13,auVar13);
  auVar13 = vfmadd231sd_fma(auVar13,auVar11,auVar11);
  dVar15 = auVar13._0_8_;
  if (dVar15 <= 1e-30) {
    dVar15 = 2.0;
  }
  else {
    if (dVar15 < 0.0) {
      dVar15 = sqrt(dVar15);
    }
    else {
      auVar13 = vsqrtsd_avx(auVar13,auVar13);
      dVar15 = auVar13._0_8_;
    }
    dVar14 = atan2(dVar15,dVar14);
    dVar15 = (dVar14 + dVar14) / dVar15;
  }
  dVar14 = dVar45 * dVar17 * dVar15;
  dVar17 = dVar45 * dVar18 * dVar15;
  dVar18 = dVar45 * dVar16 * dVar15;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar17 * dVar17;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar14;
  auVar13 = vfmadd231sd_fma(auVar21,auVar31,auVar31);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar18;
  auVar13 = vfmadd231sd_fma(auVar13,auVar25,auVar25);
  dVar16 = auVar13._0_8_;
  if (dVar16 <= 1e-30) {
    dVar16 = 0.5;
    auVar13 = ZEXT816(0x3ff0000000000000);
  }
  else {
    if (dVar16 < 0.0) {
      dVar15 = sqrt(dVar16);
    }
    else {
      auVar13 = vsqrtsd_avx(auVar13,auVar13);
      dVar15 = auVar13._0_8_;
    }
    dVar16 = sin(dVar15 * 0.5);
    dVar16 = dVar16 / dVar15;
    auVar23._0_8_ = cos(dVar15 * 0.5);
    auVar23._8_56_ = extraout_var;
    auVar13 = auVar23._0_16_;
  }
  dVar15 = auVar13._0_8_;
  __return_storage_ptr__->m_data[0] = dVar15;
  __return_storage_ptr__->m_data[1] = dVar14 * dVar16;
  __return_storage_ptr__->m_data[2] = dVar17 * dVar16;
  __return_storage_ptr__->m_data[3] = dVar18 * dVar16;
  if (0 < this->p) {
    auVar51._8_8_ = 0;
    auVar51._0_8_ = __return_storage_ptr__->m_data[1];
    auVar54._8_8_ = 0;
    auVar54._0_8_ = __return_storage_ptr__->m_data[2];
    auVar48._8_8_ = 0;
    auVar48._0_8_ = __return_storage_ptr__->m_data[3];
    lVar9 = 0;
    lVar10 = lVar10 * 0x20;
    do {
      lVar1 = lVar9 + 1;
      auVar46._0_8_ = auVar13._0_8_;
      auVar49._0_8_ = auVar48._0_8_;
      auVar52._0_8_ = auVar51._0_8_;
      auVar55._0_8_ = auVar54._0_8_;
      if (local_78.m_storage.m_rows < lVar1) {
        __return_storage_ptr__->m_data[1] = auVar52._0_8_;
        __return_storage_ptr__->m_data[2] = auVar55._0_8_;
        __return_storage_ptr__->m_data[3] = auVar49._0_8_;
        __return_storage_ptr__->m_data[0] = auVar46._0_8_;
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      dVar45 = dVar45 - local_78.m_storage.m_data[lVar9];
      pCVar8 = (this->rotations).
               super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar2 = *(ulong *)((long)pCVar8->m_data + lVar10);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar2;
      uVar3 = *(ulong *)((long)pCVar8->m_data + lVar10 + 8);
      dVar14 = *(double *)((long)pCVar8->m_data + lVar10 + 0x10);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = dVar14;
      uVar4 = *(ulong *)((long)pCVar8->m_data + lVar10 + 0x18);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uVar4;
      dVar17 = *(double *)((long)pCVar8[1].m_data + lVar10);
      auVar58._8_8_ = 0;
      auVar58._0_8_ = dVar17;
      uVar5 = *(ulong *)((long)pCVar8[1].m_data + lVar10 + 8);
      uVar6 = *(ulong *)((long)pCVar8[1].m_data + lVar10 + 0x10);
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar6;
      uVar7 = *(ulong *)((long)pCVar8[1].m_data + lVar10 + 0x18);
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar7;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = uVar3;
      auVar11 = vmulsd_avx512f(auVar58,auVar60);
      auVar63._8_8_ = 0;
      auVar63._0_8_ = uVar5;
      auVar11 = vfmsub231sd_avx512f(auVar11,auVar37,auVar63);
      auVar11 = vfmadd231sd_fma(auVar11,auVar34,auVar59);
      auVar20 = vfnmadd231sd_fma(auVar11,auVar41,auVar57);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = dVar17 * dVar14;
      auVar11 = vfmsub231sd_fma(auVar29,auVar37,auVar59);
      auVar11 = vfnmadd231sd_avx512f(auVar11,auVar34,auVar63);
      auVar11 = vfmadd231sd_avx512f(auVar11,auVar60,auVar57);
      dVar18 = auVar11._0_8_;
      auVar11 = vmulsd_avx512f(auVar58,auVar34);
      auVar11 = vfmsub231sd_avx512f(auVar11,auVar37,auVar57);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = uVar5;
      auVar11 = vfmadd231sd_avx512f(auVar11,auVar41,auVar64);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar3;
      auVar12 = vfnmadd231sd_avx512f(auVar11,auVar61,auVar59);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar18 * dVar18;
      auVar11 = vfmadd231sd_fma(auVar22,auVar20,auVar20);
      auVar11 = vfmadd231sd_avx512f(auVar11,auVar12,auVar12);
      dVar16 = auVar11._0_8_;
      auVar26 = ZEXT816(0x4000000000000000);
      auVar53 = auVar51;
      auVar47 = auVar13;
      auVar56 = auVar54;
      if (1e-30 < dVar16) {
        vmovsd_avx512f(auVar12);
        local_60 = dVar18;
        if (dVar16 < 0.0) {
          vmovsd_avx512f(auVar61);
          vmovsd_avx512f(auVar64);
          local_48 = uVar6;
          local_40 = dVar17;
          local_38 = uVar7;
          local_30 = dVar14;
          dVar14 = sqrt(dVar16);
          auVar59._8_8_ = 0;
          auVar59._0_8_ = local_48;
          auVar58._8_8_ = 0;
          auVar58._0_8_ = local_40;
          auVar57._8_8_ = 0;
          auVar57._0_8_ = local_38;
          auVar41._8_8_ = 0;
          auVar41._0_8_ = local_30;
          uVar3 = local_50;
          uVar5 = local_58;
        }
        else {
          auVar13 = vsqrtsd_avx(auVar11,auVar11);
          dVar14 = auVar13._0_8_;
        }
        auVar38._8_8_ = 0;
        auVar38._0_8_ = uVar2;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = uVar4;
        auVar62._8_8_ = 0;
        auVar62._0_8_ = uVar3;
        auVar65._8_8_ = 0;
        auVar65._0_8_ = uVar5;
        auVar13 = vmulsd_avx512f(auVar62,auVar65);
        auVar13 = vfmadd213sd_fma(auVar58,auVar38,auVar13);
        auVar13 = vfmadd213sd_fma(auVar59,auVar41,auVar13);
        auVar13 = vfmadd213sd_fma(auVar57,auVar35,auVar13);
        dVar17 = atan2(dVar14,auVar13._0_8_);
        auVar26._0_8_ = (dVar17 + dVar17) / dVar14;
        auVar26._8_8_ = 0;
        auVar46._8_8_ = 0;
        auVar49._8_8_ = 0;
        auVar52._8_8_ = 0;
        auVar55._8_8_ = 0;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = local_68;
        dVar18 = local_60;
        auVar48 = auVar49;
        auVar53 = auVar52;
        auVar47 = auVar46;
        auVar56 = auVar55;
      }
      auVar13 = vmulsd_avx512f(auVar12,auVar26);
      dVar16 = dVar45 * auVar20._0_8_ * auVar26._0_8_;
      dVar14 = dVar45 * dVar18 * auVar26._0_8_;
      dVar17 = dVar45 * auVar13._0_8_;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar14 * dVar14;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = dVar16;
      auVar13 = vfmadd231sd_fma(auVar27,auVar32,auVar32);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = dVar17;
      auVar13 = vfmadd231sd_fma(auVar13,auVar42,auVar42);
      dVar15 = auVar13._0_8_;
      dVar18 = 0.5;
      auVar11 = ZEXT816(0x3ff0000000000000);
      if (1e-30 < dVar15) {
        local_68 = dVar17;
        local_60 = dVar14;
        if (dVar15 < 0.0) {
          dVar14 = sqrt(dVar15);
        }
        else {
          auVar13 = vsqrtsd_avx(auVar13,auVar13);
          dVar14 = auVar13._0_8_;
        }
        dVar18 = sin(dVar14 * 0.5);
        dVar18 = dVar18 / dVar14;
        auVar24._0_8_ = cos(dVar14 * 0.5);
        auVar24._8_56_ = extraout_var_00;
        auVar11 = auVar24._0_16_;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = auVar46._0_8_;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = auVar49._0_8_;
        auVar53._8_8_ = 0;
        auVar53._0_8_ = auVar52._0_8_;
        auVar56._8_8_ = 0;
        auVar56._0_8_ = auVar55._0_8_;
        dVar14 = local_60;
        dVar17 = local_68;
      }
      dVar16 = dVar18 * dVar16;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = auVar53._0_8_ * dVar16;
      auVar13 = vfmsub231sd_fma(auVar28,auVar47,auVar11);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = dVar18 * dVar14;
      auVar13 = vfnmadd231sd_fma(auVar13,auVar56,auVar39);
      auVar43._8_8_ = 0;
      auVar43._0_8_ = dVar18 * dVar17;
      auVar13 = vfnmadd231sd_fma(auVar13,auVar48,auVar43);
      dVar15 = auVar13._0_8_;
      dVar19 = auVar11._0_8_;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = auVar53._0_8_ * dVar19;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = dVar16;
      auVar11 = vfmadd231sd_fma(auVar30,auVar47,auVar36);
      auVar11 = vfnmadd231sd_fma(auVar11,auVar48,auVar39);
      auVar51 = vfmadd231sd_fma(auVar11,auVar56,auVar43);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = auVar56._0_8_ * dVar19;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = dVar18 * dVar14;
      auVar11 = vfmadd231sd_fma(auVar33,auVar47,auVar40);
      auVar11 = vfmadd231sd_fma(auVar11,auVar48,auVar36);
      auVar44._8_8_ = 0;
      auVar44._0_8_ = dVar18 * dVar17;
      auVar54 = vfnmadd231sd_fma(auVar11,auVar53,auVar44);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = auVar48._0_8_ * dVar19;
      auVar11 = vfmadd231sd_fma(auVar50,auVar47,auVar44);
      auVar11 = vfnmadd231sd_fma(auVar11,auVar56,auVar36);
      auVar48 = vfmadd231sd_fma(auVar11,auVar53,auVar40);
      lVar9 = lVar1;
      lVar10 = lVar10 + 0x20;
    } while (lVar1 < this->p);
    __return_storage_ptr__->m_data[1] = auVar51._0_8_;
    __return_storage_ptr__->m_data[2] = auVar54._0_8_;
    __return_storage_ptr__->m_data[3] = auVar48._0_8_;
  }
  __return_storage_ptr__->m_data[0] = dVar15;
  if (local_78.m_storage.m_data != (double *)0x0) {
    free((void *)local_78.m_storage.m_data[-1]);
  }
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<> ChFunctionRotation_spline::Get_q(double s) const {
	
	double fs = space_fx->Get_y(s);

	double mU;
	if (this->closed)
		mU = fmod(fs, 1.0);
	else
		mU = fs;

    double u = ComputeKnotUfromU(mU);

    int spanU = geometry::ChBasisToolsBspline::FindSpan(this->p, u, this->knots);

    ChVectorDynamic<> N(this->p + 1);
    geometry::ChBasisToolsBspline::BasisEvaluate(this->p, spanU, u, this->knots, N);

	// Use the quaternion spline interpolation as in Kim & Kim 1995 paper, ie. with cumulative basis.
	// Note: now, instead of creating a ChVectorDynamic<> Bi(this->p + 1); vector containing all the basis
	// recomputed in cumulative form, we just use a single scalar Bi and update it only when needed.
	
    int uind = spanU - p;
	ChQuaternion<> qqpowBi;
	ChQuaternion<> q0 = rotations[uind + 0];  // q0
	ChQuaternion<> q; 
	double Bi = 0;
	// should be Bi(0) = 1 in most cases, anyway: compute first cumulative basis:
	for (int j = 0; j < N.size(); ++j)
		Bi += N(j);  
	q.Q_from_Rotv(q0.Q_to_Rotv() * Bi);

    for (int i = 1; i <= this->p; i++) {
		// update cumulative basis - avoids repeating the sums, as it should be:  Bi=0; for (int j = i; j < N.size(); ++j) {Bi += N(j);} 
		Bi -= N(i-1); 
		// compute delta rotation
		qqpowBi.Q_from_Rotv((rotations[uind + i - 1].GetConjugate() * rotations[uind + i]).Q_to_Rotv() * Bi);
		// apply delta rotation
		q *= qqpowBi;
    }

	return q;
}